

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfstrmatrix.cpp
# Opt level: O2

TPZStructMatrix * __thiscall
TPZFStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>::Clone
          (TPZFStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *this)

{
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xc0);
  TPZFStructMatrix((TPZFStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *)this_00,this);
  return this_00;
}

Assistant:

TPZStructMatrix * TPZFStructMatrix<TVar,TPar>::Clone(){
    return new TPZFStructMatrix(*this);
}